

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrecheckPass.cpp
# Opt level: O2

PreservedAnalyses * __thiscall
Precheck::run(PreservedAnalyses *__return_storage_ptr__,Precheck *this,Function *F,
             FunctionAnalysisManager *FM)

{
  char cVar1;
  Twine *Suffix;
  char *Str;
  Twine *this_00;
  PreservedAnalyses *__return_storage_ptr___00;
  StringRef SVar2;
  StringRef local_a0;
  Twine local_90;
  Twine local_68;
  
  SVar2.Length = (size_t)"shellvm-main";
  SVar2.Data = (char *)F;
  cVar1 = llvm::Function::hasFnAttribute(SVar2);
  if (cVar1 == '\0') {
    if ((*(uint *)(F + 0x20) & 0xc0) == 0) goto LAB_001230fa;
    local_a0 = (StringRef)llvm::Value::getName();
    llvm::operator+(&local_68,"Function ",&local_a0);
    Str = " is not marked as unnamed_addr!";
  }
  else {
    if ((*(uint *)(F + 0x20) & 0xc0) == 0x40) {
LAB_001230fa:
      llvm::PreservedAnalyses::all();
      return __return_storage_ptr__;
    }
    local_a0 = (StringRef)llvm::Value::getName();
    llvm::operator+(&local_68,"SheLLVM main function ",&local_a0);
    Str = " is not marked as local_unnamed_addr!";
  }
  llvm::Twine::Twine(&local_90,Str);
  __return_storage_ptr___00 = (PreservedAnalyses *)&stack0xffffffffffffffc0;
  llvm::operator+((Twine *)__return_storage_ptr___00,&local_68,&local_90);
  this_00 = (Twine *)0x1;
  llvm::report_fatal_error((Twine *)__return_storage_ptr___00,true);
  llvm::Twine::concat((Twine *)__return_storage_ptr___00,this_00,Suffix);
  return __return_storage_ptr___00;
}

Assistant:

llvm::PreservedAnalyses Precheck::run(Function &F,
                                      FunctionAnalysisManager &FM) {
  if (!F.hasFnAttribute("shellvm-main")) {
    if (F.getUnnamedAddr() != GlobalValue::UnnamedAddr::None) {
      report_fatal_error("Function " + F.getName() +
                         " is not marked as unnamed_addr!");
    }
  } else {
    if (F.getUnnamedAddr() != GlobalValue::UnnamedAddr::Local) {
      report_fatal_error("SheLLVM main function " + F.getName() +
                         " is not marked as local_unnamed_addr!");
    }
  }

  return PreservedAnalyses::all();
}